

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O3

err_t InternalRender(ebml_master *Element,stream *Output,bool_t bForceWithoutMandatory,
                    bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  ebml_master *peVar1;
  err_t eVar2;
  long lVar3;
  bool bVar4;
  filepos_t ItemRendered;
  long local_38;
  
  do {
    if (Element == (ebml_master *)0x0) {
      return 0;
    }
    if ((bWithDefault != 0) ||
       (lVar3 = (**(code **)((long)(Element->Base).Base.Base.VMT + 0x88))(Element), lVar3 == 0)) {
      eVar2 = EBML_ElementRender(&Element->Base,Output,bWithDefault,0,bForceWithoutMandatory,
                                 ForProfile,&local_38);
      if (eVar2 != 0) {
        return eVar2;
      }
      *Rendered = *Rendered + local_38;
    }
    peVar1 = (ebml_master *)(Element->Base).Base.Next;
    bVar4 = Element != peVar1;
    Element = peVar1;
  } while (bVar4);
  __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                ,0x1c3,
                "err_t InternalRender(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
               );
}

Assistant:

static err_t InternalRender(ebml_master *Element, struct stream *Output, bool_t bForceWithoutMandatory, bool_t bWithDefault, int ForProfile, filepos_t *Rendered)
{
    ebml_element *i;
    filepos_t ItemRendered;
    err_t Err = ERR_NONE;
    for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
    {
		if (!bWithDefault && EBML_ElementIsDefaultValue(i))
			continue;
		Err = EBML_ElementRender(i,Output, bWithDefault, 0, bForceWithoutMandatory, ForProfile, &ItemRendered);
        if (Err!=ERR_NONE)
            return Err;
        *Rendered += ItemRendered;
	}
    return Err;
}